

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

bool __thiscall cmTarget::HaveBuildTreeRPATH(cmTarget *this,string *config)

{
  bool bVar1;
  LinkImplementationLibraries *this_00;
  LinkImplementationLibraries *impl;
  allocator local_41;
  string local_40;
  string *local_20;
  string *config_local;
  cmTarget *this_local;
  
  local_20 = config;
  config_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"SKIP_BUILD_RPATH",&local_41);
  bVar1 = GetPropertyAsBool(this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = GetLinkImplementationLibraries(this,local_20);
    if (this_00 == (LinkImplementationLibraries *)0x0) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::empty
                        (&this_00->Libraries);
      this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmTarget::HaveBuildTreeRPATH(const std::string& config) const
{
  if (this->GetPropertyAsBool("SKIP_BUILD_RPATH"))
    {
    return false;
    }
  if(LinkImplementationLibraries const* impl =
     this->GetLinkImplementationLibraries(config))
    {
    return !impl->Libraries.empty();
    }
  return false;
}